

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall
SslTcpServerImpl::AddCertificate
          (SslTcpServerImpl *this,char *szCAcertificate,char *szHostCertificate,char *szHostKey)

{
  reference pvVar1;
  wchar_t *pOut;
  bool bVar2;
  wstring local_100;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c0;
  int local_a0;
  int iRet;
  SslServerContext local_90;
  char *local_30;
  char *szHostKey_local;
  char *szHostCertificate_local;
  char *szCAcertificate_local;
  SslTcpServerImpl *this_local;
  
  local_30 = szHostKey;
  szHostKey_local = szHostCertificate;
  szHostCertificate_local = szCAcertificate;
  szCAcertificate_local = (char *)this;
  OpenSSLWrapper::SslServerContext::SslServerContext(&local_90);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,&local_90);
  OpenSSLWrapper::SslServerContext::~SslServerContext(&local_90);
  pvVar1 = std::
           vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
           ::back(&this->m_SslCtx);
  local_a0 = OpenSSLWrapper::SslServerContext::SetCertificates
                       (pvVar1,szHostCertificate_local,szHostKey_local,local_30);
  bVar2 = local_a0 == 1;
  if (bVar2) {
    pvVar1 = std::
             vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ::back(&this->m_SslCtx);
    OpenSSLWrapper::SslServerContext::AddVirtualHost(pvVar1,&this->m_SslCtx);
  }
  else {
    std::__cxx11::to_wstring(&local_100,local_a0);
    std::operator+(&local_e0,L"Certificate could not be loaded, error: ",&local_100);
    std::operator+(&local_c0,&local_e0,L"\r\n");
    pOut = (wchar_t *)std::__cxx11::wstring::c_str();
    OutputDebugString(pOut);
    std::__cxx11::wstring::~wstring((wstring *)&local_c0);
    std::__cxx11::wstring::~wstring((wstring *)&local_e0);
    std::__cxx11::wstring::~wstring((wstring *)&local_100);
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::pop_back(&this->m_SslCtx);
  }
  return bVar2;
}

Assistant:

bool SslTcpServerImpl::AddCertificate(const char* const szCAcertificate, const char* const szHostCertificate, const char* const szHostKey)
{
    m_SslCtx.emplace_back(SslServerContext());
    const int iRet = m_SslCtx.back().SetCertificates(szCAcertificate, szHostCertificate, szHostKey);
    if (iRet != 1)
    {
        OutputDebugString(wstring(L"Certificate could not be loaded, error: " + to_wstring(iRet) + L"\r\n").c_str());
        m_SslCtx.pop_back();
        return false;
    }
    m_SslCtx.back().AddVirtualHost(&m_SslCtx);
    return true;
}